

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

IceTSizeType colorPixelSize(IceTEnum color_format)

{
  if (color_format - 0xc000 < 3) {
    return *(IceTSizeType *)(&DAT_0011ddbc + (ulong)(color_format - 0xc000) * 4);
  }
  icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,0xda);
  return 0;
}

Assistant:

static IceTSizeType colorPixelSize(IceTEnum color_format)
{
    switch (color_format) {
      case ICET_IMAGE_COLOR_RGBA_UBYTE: return 4;
      case ICET_IMAGE_COLOR_RGBA_FLOAT: return 4*sizeof(IceTFloat);
      case ICET_IMAGE_COLOR_NONE:       return 0;
      default:
          icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
          return 0;
    }
}